

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::__cxx11::string>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values,uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dest)

{
  uint uVar1;
  undefined8 uVar2;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *in_RAX;
  ulong uVar3;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  long *plVar5;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX_00;
  unexpected_type<const_char_*> uVar6;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *extraout_RAX_01;
  undefined4 in_register_0000000c;
  undefined8 uVar7;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  value_type_conflict vVar11;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar12;
  long lVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  unexpected_type<const_char_*> local_a0;
  undefined8 local_98;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_90;
  anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *local_70;
  undefined8 local_68;
  undefined1 local_60 [32];
  long local_40;
  
  uVar7 = CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_a0.m_error = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_a0);
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)extraout_RAX;
  }
  if (*(long *)uVar7 == *(long *)(uVar7 + 8)) {
    pvVar4 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)indices,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
               *)CONCAT71((int7)((ulong)pvVar4 >> 8),1);
  }
  if ((int)values == 0) {
LAB_00463071:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_RAX;
  }
  uVar3 = *(long *)(this + 8) - *(long *)this >> 5;
  uVar10 = (ulong)values & 0xffffffff;
  in_RAX = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
            *)(uVar3 / uVar10);
  if (uVar3 % uVar10 != 0) goto LAB_00463071;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)indices,(*(long *)(uVar7 + 8) - *(long *)uVar7 >> 2) * uVar10);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_a0.m_error = (error_type)0x0;
  lVar13 = *(long *)uVar7;
  if (*(long *)(uVar7 + 8) == lVar13) {
    vVar11 = true;
  }
  else {
    vVar11 = true;
    local_90._16_8_ = __return_storage_ptr__;
    local_90._24_8_ = uVar7;
    do {
      uVar1 = *(uint *)(lVar13 + (long)local_a0.m_error * 4);
      if (((int)uVar1 < 0) ||
         (uVar3 = ((ulong)uVar1 + 1) * uVar10, uVar9 = *(long *)(this + 8) - *(long *)this >> 5,
         uVar9 <= uVar3 && uVar3 - uVar9 != 0)) {
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_a0);
        }
        else {
          *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_a0.m_error;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        vVar11 = false;
      }
      else {
        lVar13 = 0;
        do {
          ::std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start +
                     lVar13 + (long)local_a0.m_error * uVar10 * 0x20));
          lVar13 = lVar13 + 0x20;
          uVar7 = local_90._24_8_;
        } while (uVar10 << 5 != lVar13);
      }
      uVar2 = local_90._16_8_;
      local_a0.m_error = local_a0.m_error + 1;
      lVar13 = *(long *)uVar7;
    } while (local_a0.m_error <
             (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
              *)(*(long *)(uVar7 + 8) - lVar13 >> 2));
    __return_storage_ptr__ =
         (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_90._16_8_;
    if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      tinyusdz::value::print_array_snipped<unsigned_long>((string *)(local_60 + 0x10),&local_b8,5);
      plVar5 = (long *)::std::__cxx11::string::replace
                                 ((ulong)(local_60 + 0x10),0,(char *)0x0,0x5efdb9);
      local_70 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_60;
      paVar12 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                 *)(plVar5 + 2);
      if ((anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
           *)*plVar5 == paVar12) {
        local_60._0_8_ =
             (((storage_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                *)&(paVar12->m_error)._M_dataplus)->
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).field_0.m_error._M_dataplus._M_p;
        local_60._8_8_ = plVar5[3];
        paVar8 = local_70;
      }
      else {
        local_60._0_8_ =
             (((storage_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                *)&(paVar12->m_error)._M_dataplus)->
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).field_0.m_error._M_dataplus._M_p;
        paVar8 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)*plVar5;
      }
      local_90.m_error._M_dataplus._M_p = (_Alloc_hider)local_60._0_8_;
      lVar13 = plVar5[1];
      *plVar5 = (long)paVar12;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_a0.m_error = (error_type)&local_90;
      if (paVar8 == local_70) {
        local_90.m_error._M_string_length = local_60._8_8_;
        paVar8 = (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_a0.m_error;
      }
      local_68 = 0;
      local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
      *(bool *)(uVar2 + 0x20) = false;
      *(_Alloc_hider **)uVar2 = (_Alloc_hider *)(uVar2 + 0x10);
      if (paVar8 == (anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                     *)local_a0.m_error) {
        ((_Alloc_hider *)(uVar2 + 0x10))->_M_p = (pointer)local_90.m_error._M_dataplus._M_p;
        *(size_type *)(uVar2 + 0x18) = local_90.m_error._M_string_length;
      }
      else {
        *(anon_union_32_2_293c120a_for_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
          **)uVar2 = paVar8;
        ((_Alloc_hider *)(uVar2 + 0x10))->_M_p = (pointer)local_90.m_error._M_dataplus._M_p;
      }
      *(long *)(uVar2 + 8) = lVar13;
      local_98 = 0;
      local_90.m_error._M_dataplus._M_p =
           (_Alloc_hider)((ulong)local_90.m_error._M_dataplus._M_p & 0xffffffffffffff00);
      uVar6.m_error = local_60 + 0x20;
      if ((error_type)local_60._16_8_ != uVar6.m_error) {
        operator_delete((void *)local_60._16_8_,local_40 + 1);
        uVar6.m_error = (error_type)extraout_RAX_00;
      }
      goto LAB_004632de;
    }
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = vVar11;
  uVar6.m_error = local_a0.m_error;
LAB_004632de:
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)uVar6.m_error;
  }
  operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)extraout_RAX_01;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}